

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

int __thiscall QSqlTableModelPrivate::nameToIndex(QSqlTableModelPrivate *this,QString *name)

{
  QAnyStringView name_00;
  int iVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  QSqlTableModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QSqlRecord *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QSqlRecord local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_30;
  strippedFieldName(in_RDI,(QString *)in_RSI.m_data);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_RSI.m_data,
             (QString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  name_00.m_size = (size_t)in_RDI;
  name_00.field_0.m_data = in_RSI.m_data;
  iVar1 = QSqlRecord::indexOf(this_00,name_00);
  QString::~QString((QString *)0x16b746);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModelPrivate::nameToIndex(const QString &name) const
{
    return rec.indexOf(strippedFieldName(name));
}